

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O1

REF_STATUS ref_list_delete(REF_LIST ref_list,REF_INT item)

{
  REF_INT *pRVar1;
  REF_STATUS RVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = ref_list->n;
  if (iVar5 < 1) {
    iVar3 = 0;
  }
  else {
    pRVar1 = ref_list->value;
    lVar4 = 0;
    iVar3 = 0;
    do {
      iVar5 = pRVar1[lVar4];
      if (iVar5 != item) {
        pRVar1[iVar3] = iVar5;
        iVar3 = iVar3 + 1;
      }
      lVar4 = lVar4 + 1;
      iVar5 = ref_list->n;
    } while (lVar4 < iVar5);
  }
  RVar2 = 5;
  if (iVar3 != iVar5) {
    ref_list->n = iVar3;
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_list_delete(REF_LIST ref_list, REF_INT item) {
  REF_INT to, from;

  to = 0;
  for (from = 0; from < ref_list_n(ref_list); from++) {
    if (item != ref_list->value[from]) {
      ref_list->value[to] = ref_list->value[from];
      to++;
    }
  }

  if (to == ref_list_n(ref_list)) return REF_NOT_FOUND;

  ref_list_n(ref_list) = to;

  return REF_SUCCESS;
}